

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

fnode_service_state_t fnode_service_process_commands(fnode_service_t *svc)

{
  size_t time_wait;
  size_t time_elapsed;
  size_t time_now;
  size_t es_num;
  size_t rs_num;
  fnet_socket_t es;
  fnet_socket_t rs;
  size_t *in_stack_00000160;
  fnet_socket_t *in_stack_00000168;
  size_t *in_stack_00000170;
  fnet_socket_t *in_stack_00000178;
  size_t in_stack_00000180;
  fnet_socket_t *in_stack_00000188;
  size_t in_stack_000001a0;
  
  fnode_service_time();
  fnet_socket_select(in_stack_00000188,in_stack_00000180,in_stack_00000178,in_stack_00000170,
                     in_stack_00000168,in_stack_00000160,in_stack_000001a0);
  return FSVC_NOTIFY_STATUS;
}

Assistant:

fnode_service_state_t fnode_service_process_commands(fnode_service_t *svc)
{
    fnet_socket_t rs, es;
    size_t rs_num = 0, es_num = 0;

    size_t time_now = fnode_service_time();
    size_t time_elapsed = time_now - svc->last_cmd_time;
    size_t time_wait = time_elapsed < svc->keepalive ? svc->keepalive - time_elapsed : 1;

    if (fnet_socket_select(&svc->socket, 1, &rs, &rs_num, &es, &es_num, time_wait) && rs_num)
        fnode_service_recv_cmd(svc);

    return FSVC_NOTIFY_STATUS;
}